

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlEnumerationPtr xmlParseNotationType(xmlParserCtxtPtr ctxt)

{
  xmlEnumerationPtr pxVar1;
  int iVar2;
  xmlChar *str1;
  xmlEnumerationPtr pxVar3;
  xmlEnumerationPtr local_40;
  xmlEnumerationPtr tmp;
  xmlEnumerationPtr cur;
  xmlEnumerationPtr last;
  xmlEnumerationPtr ret;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  last = (xmlEnumerationPtr)0x0;
  cur = (xmlEnumerationPtr)0x0;
  if (*ctxt->input->cur == '(') {
    do {
      xmlNextChar(ctxt);
      xmlSkipBlankCharsPE(ctxt);
      str1 = xmlParseName(ctxt);
      if (str1 == (xmlChar *)0x0) {
        xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"Name expected in NOTATION declaration\n");
        xmlFreeEnumeration(last);
        return (xmlEnumerationPtr)0x0;
      }
      for (local_40 = last; local_40 != (xmlEnumerationPtr)0x0; local_40 = local_40->next) {
        iVar2 = xmlStrEqual(str1,local_40->name);
        if (iVar2 != 0) {
          xmlValidityError(ctxt,XML_DTD_DUP_TOKEN,
                           "standalone: attribute notation value token %s duplicated\n",str1,
                           (xmlChar *)0x0);
          iVar2 = xmlDictOwns(ctxt->dict,str1);
          if (iVar2 == 0) {
            (*xmlFree)(str1);
          }
          break;
        }
      }
      pxVar3 = cur;
      pxVar1 = last;
      if (local_40 == (xmlEnumerationPtr)0x0) {
        pxVar3 = xmlCreateEnumeration(str1);
        if (pxVar3 == (xmlEnumerationPtr)0x0) {
          xmlErrMemory(ctxt);
          xmlFreeEnumeration(last);
          return (xmlEnumerationPtr)0x0;
        }
        pxVar1 = pxVar3;
        if (cur != (xmlEnumerationPtr)0x0) {
          cur->next = pxVar3;
          pxVar1 = last;
        }
      }
      last = pxVar1;
      cur = pxVar3;
      xmlSkipBlankCharsPE(ctxt);
    } while (*ctxt->input->cur == '|');
    if (*ctxt->input->cur == ')') {
      xmlNextChar(ctxt);
      ctxt_local = (xmlParserCtxtPtr)last;
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_FINISHED,(char *)0x0);
      xmlFreeEnumeration(last);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_NOTATION_NOT_STARTED,(char *)0x0);
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  return (xmlEnumerationPtr)ctxt_local;
}

Assistant:

xmlEnumerationPtr
xmlParseNotationType(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    xmlEnumerationPtr ret = NULL, last = NULL, cur, tmp;

    if (RAW != '(') {
	xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_STARTED, NULL);
	return(NULL);
    }
    do {
        NEXT;
	SKIP_BLANKS_PE;
        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "Name expected in NOTATION declaration\n");
            xmlFreeEnumeration(ret);
	    return(NULL);
	}
	tmp = ret;
	while (tmp != NULL) {
	    if (xmlStrEqual(name, tmp->name)) {
		xmlValidityError(ctxt, XML_DTD_DUP_TOKEN,
	  "standalone: attribute notation value token %s duplicated\n",
				 name, NULL);
		if (!xmlDictOwns(ctxt->dict, name))
		    xmlFree((xmlChar *) name);
		break;
	    }
	    tmp = tmp->next;
	}
	if (tmp == NULL) {
	    cur = xmlCreateEnumeration(name);
	    if (cur == NULL) {
                xmlErrMemory(ctxt);
                xmlFreeEnumeration(ret);
                return(NULL);
            }
	    if (last == NULL) ret = last = cur;
	    else {
		last->next = cur;
		last = cur;
	    }
	}
	SKIP_BLANKS_PE;
    } while (RAW == '|');
    if (RAW != ')') {
	xmlFatalErr(ctxt, XML_ERR_NOTATION_NOT_FINISHED, NULL);
        xmlFreeEnumeration(ret);
	return(NULL);
    }
    NEXT;
    return(ret);
}